

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int coda_cdf_reopen(coda_product **product)

{
  coda_product *pcVar1;
  ulong a;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [11];
  undefined1 auVar57 [15];
  undefined1 auVar58 [11];
  undefined1 auVar59 [15];
  undefined1 auVar60 [11];
  undefined1 auVar61 [15];
  undefined1 auVar62 [11];
  undefined1 auVar63 [15];
  undefined1 auVar64 [11];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  ulong uVar79;
  ulong offset;
  int iVar80;
  coda_endianness cVar81;
  coda_cdf_product *product_file;
  char *pcVar82;
  coda_type_record *definition;
  coda_mem_record *pcVar83;
  int32_t *dst;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  uint local_b4;
  uint local_b0;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  char local_68 [32];
  char s1 [21];
  undefined1 auVar94 [16];
  
  product_file = (coda_cdf_product *)malloc(0x90);
  if (product_file == (coda_cdf_product *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x90,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5d8);
    coda_close(*product);
    return -1;
  }
  pcVar1 = *product;
  product_file->file_size = pcVar1->file_size;
  product_file->format = coda_format_cdf;
  product_file->root_type = (coda_mem_record *)0x0;
  product_file->product_definition = (coda_product_definition *)0x0;
  product_file->product_variable_size = (long *)0x0;
  product_file->product_variable = (int64_t **)0x0;
  product_file->mem_size = 0;
  product_file->mem_ptr = (uint8_t *)0x0;
  product_file->raw_product = pcVar1;
  pcVar82 = strdup(pcVar1->filename);
  product_file->filename = pcVar82;
  if (pcVar82 == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate filename string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                   ,0x5ec);
    coda_cdf_close((coda_product *)product_file);
    return -1;
  }
  iVar80 = read_bytes(pcVar1,0,8,&local_98);
  if (iVar80 < 0) goto LAB_00120a8d;
  auVar14._8_6_ = 0;
  auVar14._0_8_ = local_98;
  auVar14[0xe] = (char)(local_98 >> 0x38);
  auVar20._8_4_ = 0;
  auVar20._0_8_ = local_98;
  auVar20[0xc] = (char)(local_98 >> 0x30);
  auVar20._13_2_ = auVar14._13_2_;
  auVar26._8_4_ = 0;
  auVar26._0_8_ = local_98;
  auVar26._12_3_ = auVar20._12_3_;
  auVar32._8_2_ = 0;
  auVar32._0_8_ = local_98;
  auVar32[10] = (char)(local_98 >> 0x28);
  auVar32._11_4_ = auVar26._11_4_;
  auVar38._8_2_ = 0;
  auVar38._0_8_ = local_98;
  auVar38._10_5_ = auVar32._10_5_;
  auVar44[8] = (char)(local_98 >> 0x20);
  auVar44._0_8_ = local_98;
  auVar44._9_6_ = auVar38._9_6_;
  auVar54._7_8_ = 0;
  auVar54._0_7_ = auVar44._8_7_;
  auVar65._1_8_ = SUB158(auVar54 << 0x40,7);
  auVar65[0] = (char)(local_98 >> 0x18);
  auVar65._9_6_ = 0;
  auVar66._1_10_ = SUB1510(auVar65 << 0x30,5);
  auVar66[0] = (char)(local_98 >> 0x10);
  auVar66._11_4_ = 0;
  auVar84._3_12_ = SUB1512(auVar66 << 0x20,3);
  auVar84[2] = (char)(local_98 >> 8);
  auVar84[0] = (byte)local_98;
  auVar84[1] = 0;
  auVar84[0xf] = 0;
  auVar84 = pshuflw(auVar84,auVar84,0x1b);
  auVar84 = pshufhw(auVar84,auVar84,0x1b);
  sVar3 = auVar84._0_2_;
  sVar4 = auVar84._2_2_;
  sVar5 = auVar84._4_2_;
  sVar6 = auVar84._6_2_;
  iVar80 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                    CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                             CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] - (0xff < sVar4),
                                      (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] - (0xff < sVar3))))
  ;
  sVar3 = auVar84._8_2_;
  sVar4 = auVar84._10_2_;
  sVar5 = auVar84._12_2_;
  sVar6 = auVar84._14_2_;
  local_98 = CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar84[0xe] - (0xff < sVar6),
                      CONCAT16((0 < sVar5) * (sVar5 < 0x100) * auVar84[0xc] - (0xff < sVar5),
                               CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar84[10] - (0xff < sVar4)
                                        ,CONCAT14((0 < sVar3) * (sVar3 < 0x100) * auVar84[8] -
                                                  (0xff < sVar3),iVar80))));
  if ((iVar80 == 0xffff) || (iVar80 == -0x320d9ffe)) {
    pcVar82 = "CDF format version older than 3.0 is not supported";
LAB_00120a81:
    iVar80 = -200;
  }
  else {
    local_98._4_4_ = (int)(local_98 >> 0x20);
    if (local_98._4_4_ == -0x3333ffff) {
      pcVar82 = "full file compression not supported for CDF files";
      goto LAB_00120a81;
    }
    if ((iVar80 != -0x320cffff) || (local_98._4_4_ != 0xffff)) {
      __assert_fail("magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                    ,0x607,"int coda_cdf_reopen(coda_product **)");
    }
    definition = coda_type_record_new(coda_format_cdf);
    if (definition == (coda_type_record *)0x0) goto LAB_00120a8d;
    pcVar83 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    product_file->root_type = pcVar83;
    if (pcVar83 == (coda_mem_record *)0x0) {
      coda_cdf_close((coda_product *)product_file);
      coda_type_release((coda_type *)definition);
      return -1;
    }
    coda_type_release((coda_type *)definition);
    iVar80 = read_bytes(pcVar1,0x10,4,&local_a0);
    if (iVar80 < 0) goto LAB_00120a8d;
    auVar84 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_a0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_a0 >> 0x10),local_a0))
                                                  >> 0x20),local_a0) >> 0x18),
                                        (char)((uint)local_a0 >> 8)),(ushort)(byte)local_a0) &
                      0xffffff00ffffff);
    auVar84 = pshuflw(auVar84,auVar84,0x1b);
    sVar3 = auVar84._0_2_;
    sVar4 = auVar84._2_2_;
    sVar5 = auVar84._4_2_;
    sVar6 = auVar84._6_2_;
    local_a0 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                 CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                          (0xff < sVar4),
                                          (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                          (0xff < sVar3))));
    if (local_a0 != 1) {
      pcVar82 = "CDF file has invalid record type (%d) for CDR record";
LAB_00120d4f:
      iVar80 = -300;
LAB_00120d54:
      coda_set_error(iVar80,pcVar82);
      goto LAB_00120a8d;
    }
    iVar80 = read_bytes(pcVar1,0x14,8,&local_90);
    if (iVar80 < 0) goto LAB_00120a8d;
    iVar80 = read_bytes(pcVar1,0x1c,4,&product_file->cdf_version);
    if (iVar80 < 0) goto LAB_00120a8d;
    iVar80 = read_bytes(product_file->raw_product,0x20,4,&product_file->cdf_release);
    if (iVar80 < 0) goto LAB_00120a8d;
    pcVar1 = product_file->raw_product;
    iVar80 = read_bytes(pcVar1,0x24,4,&local_b0);
    if ((iVar80 < 0) || (iVar80 = read_bytes(pcVar1,0x28,4,&local_b4), iVar80 < 0))
    goto LAB_00120a8d;
    iVar80 = read_bytes(pcVar1,0x34,4,&product_file->cdf_increment);
    if (iVar80 < 0) goto LAB_00120a8d;
    auVar15._8_6_ = 0;
    auVar15._0_8_ = local_90;
    auVar15[0xe] = (char)(local_90 >> 0x38);
    auVar21._8_4_ = 0;
    auVar21._0_8_ = local_90;
    auVar21[0xc] = (char)(local_90 >> 0x30);
    auVar21._13_2_ = auVar15._13_2_;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = local_90;
    auVar27._12_3_ = auVar21._12_3_;
    auVar33._8_2_ = 0;
    auVar33._0_8_ = local_90;
    auVar33[10] = (char)(local_90 >> 0x28);
    auVar33._11_4_ = auVar27._11_4_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = local_90;
    auVar39._10_5_ = auVar33._10_5_;
    auVar45[8] = (char)(local_90 >> 0x20);
    auVar45._0_8_ = local_90;
    auVar45._9_6_ = auVar39._9_6_;
    auVar85[7] = 0;
    auVar85._0_7_ = auVar45._8_7_;
    auVar55._7_8_ = 0;
    auVar55._0_7_ = auVar45._8_7_;
    auVar67._1_8_ = SUB158(auVar55 << 0x40,7);
    auVar67[0] = (char)(local_90 >> 0x18);
    auVar67._9_6_ = 0;
    auVar56._1_10_ = SUB1510(auVar67 << 0x30,5);
    auVar56[0] = (char)(local_90 >> 0x10);
    auVar68._11_4_ = 0;
    auVar68._0_11_ = auVar56;
    auVar52._3_12_ = SUB1512(auVar68 << 0x20,3);
    auVar52[2] = (char)(local_90 >> 8);
    auVar52[1] = 0;
    auVar52[0] = (byte)local_90;
    auVar85._8_4_ = auVar52._0_4_;
    auVar85._12_4_ = auVar56._0_4_;
    auVar84 = pshuflw(auVar85,auVar85,0x1b);
    auVar84 = pshufhw(auVar84,auVar84,0x1b);
    sVar3 = auVar84._0_2_;
    sVar4 = auVar84._2_2_;
    sVar5 = auVar84._4_2_;
    sVar6 = auVar84._6_2_;
    sVar7 = auVar84._8_2_;
    sVar8 = auVar84._10_2_;
    sVar9 = auVar84._12_2_;
    sVar10 = auVar84._14_2_;
    local_90 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar84[0xe] - (0xff < sVar10),
                        CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar84[0xc] - (0xff < sVar9),
                                 CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar84[10] -
                                          (0xff < sVar8),
                                          CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar84[8] -
                                                   (0xff < sVar7),
                                                   CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                            auVar84[6] - (0xff < sVar6),
                                                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                     auVar84[4] - (0xff < sVar5),
                                                                     CONCAT11((0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar84[2] -
                                                                              (0xff < sVar4),
                                                                              (0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar84[0] -
                                                                              (0xff < sVar3))))))));
    swap4(&product_file->cdf_version);
    swap4(&product_file->cdf_release);
    auVar84 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_b0 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_b0 >> 0x10),local_b0)) >>
                                                  0x20),local_b0) >> 0x18),(char)(local_b0 >> 8)),
                               (ushort)(byte)local_b0) & 0xffffff00ffffff);
    auVar84 = pshuflw(auVar84,auVar84,0x1b);
    sVar3 = auVar84._0_2_;
    sVar4 = auVar84._2_2_;
    sVar5 = auVar84._4_2_;
    sVar6 = auVar84._6_2_;
    local_b0 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                 CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                          (0xff < sVar4),
                                          (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                          (0xff < sVar3))));
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_b4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_b4 >> 0x10),local_b4)) >>
                                                  0x20),local_b4) >> 0x18),
                                         CONCAT12((char)(local_b4 >> 8),(short)local_b4)) >> 0x10),
                         (short)local_b4) & 0xffff00ff00ff00ff;
    auVar84 = pshuflw(auVar86,auVar86,0x1b);
    sVar3 = auVar84._0_2_;
    sVar4 = auVar84._2_2_;
    sVar5 = auVar84._4_2_;
    sVar6 = auVar84._6_2_;
    local_b4 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                 CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                          (0xff < sVar4),
                                          (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                          (0xff < sVar3))));
    swap4(&product_file->cdf_increment);
    uVar79 = local_90;
    if (((long)local_90 < 0) || (product_file->file_size <= (long)local_90)) {
      pcVar82 = "CDF file has invalid offset for GDR record";
    }
    else {
      if (0x10 < local_b0) {
LAB_0012108d:
        pcVar82 = "CDF file has unsupported encoding %d";
        iVar80 = -200;
        goto LAB_00120d54;
      }
      cVar81 = coda_big_endian;
      if ((0x1aa6U >> (local_b0 & 0x1f) & 1) == 0) {
        if ((0x12050U >> (local_b0 & 0x1f) & 1) == 0) {
          if ((0xc008U >> (local_b0 & 0x1f) & 1) != 0) {
            pcVar82 = 
            "CDF file contains unsupported floating point format (only IEEE 754 floating point format is supported)"
            ;
            goto LAB_00120a81;
          }
          goto LAB_0012108d;
        }
        cVar81 = coda_little_endian;
      }
      product_file->endianness = cVar81;
      product_file->array_ordering = ~local_b4 & coda_array_ordering_fortran;
      if ((local_b4 & 2) == 0) {
        pcVar82 = "multi-file CDF is not supported";
        goto LAB_00120a81;
      }
      product_file->has_md5_chksum = (uint)((~local_b4 & 0xc) == coda_array_ordering_c);
      pcVar1 = product_file->raw_product;
      iVar80 = read_bytes(pcVar1,local_90 + 8,4,&local_9c);
      if (iVar80 < 0) goto LAB_00120a8d;
      auVar84 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_9c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_9c >> 0x10),local_9c))
                                                  >> 0x20),local_9c) >> 0x18),
                                          (char)((uint)local_9c >> 8)),(ushort)(byte)local_9c) &
                        0xffffff00ffffff);
      auVar84 = pshuflw(auVar84,auVar84,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      local_9c = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                          CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                   CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                            (0xff < sVar4),
                                            (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                            (0xff < sVar3))));
      if (local_9c != 2) {
        pcVar82 = "CDF file has invalid record type (%d) for GDR record";
        goto LAB_00120d4f;
      }
      iVar80 = read_bytes(pcVar1,uVar79 + 0xc,8,&local_70);
      if (((((iVar80 < 0) || (iVar80 = read_bytes(pcVar1,uVar79 + 0x14,8,&local_78), iVar80 < 0)) ||
           (iVar80 = read_bytes(pcVar1,uVar79 + 0x1c,8,&local_80), iVar80 < 0)) ||
          ((iVar80 = read_bytes(pcVar1,uVar79 + 0x24,8,&local_88), iVar80 < 0 ||
           (iVar80 = read_bytes(pcVar1,uVar79 + 0x2c,4,&local_a4), iVar80 < 0)))) ||
         (iVar80 = read_bytes(pcVar1,uVar79 + 0x30,4,&local_a8), iVar80 < 0)) goto LAB_00120a8d;
      dst = &product_file->rnum_dims;
      iVar80 = read_bytes(pcVar1,uVar79 + 0x38,4,dst);
      if ((iVar80 < 0) ||
         (iVar80 = read_bytes(product_file->raw_product,uVar79 + 0x3c,4,&local_ac), iVar80 < 0))
      goto LAB_00120a8d;
      auVar16._8_6_ = 0;
      auVar16._0_8_ = local_70;
      auVar16[0xe] = (char)(local_70 >> 0x38);
      auVar22._8_4_ = 0;
      auVar22._0_8_ = local_70;
      auVar22[0xc] = (char)(local_70 >> 0x30);
      auVar22._13_2_ = auVar16._13_2_;
      auVar28._8_4_ = 0;
      auVar28._0_8_ = local_70;
      auVar28._12_3_ = auVar22._12_3_;
      auVar34._8_2_ = 0;
      auVar34._0_8_ = local_70;
      auVar34[10] = (char)(local_70 >> 0x28);
      auVar34._11_4_ = auVar28._11_4_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = local_70;
      auVar40._10_5_ = auVar34._10_5_;
      auVar46[8] = (char)(local_70 >> 0x20);
      auVar46._0_8_ = local_70;
      auVar46._9_6_ = auVar40._9_6_;
      auVar87[7] = 0;
      auVar87._0_7_ = auVar46._8_7_;
      auVar57._7_8_ = 0;
      auVar57._0_7_ = auVar46._8_7_;
      auVar69._1_8_ = SUB158(auVar57 << 0x40,7);
      auVar69[0] = (char)(local_70 >> 0x18);
      auVar69._9_6_ = 0;
      auVar58._1_10_ = SUB1510(auVar69 << 0x30,5);
      auVar58[0] = (char)(local_70 >> 0x10);
      auVar70._11_4_ = 0;
      auVar70._0_11_ = auVar58;
      auVar53._3_12_ = SUB1512(auVar70 << 0x20,3);
      auVar53[2] = (char)(local_70 >> 8);
      auVar53[1] = 0;
      auVar53[0] = (byte)local_70;
      auVar87._8_4_ = auVar53._0_4_;
      auVar87._12_4_ = auVar58._0_4_;
      auVar84 = pshuflw(auVar87,auVar87,0x1b);
      auVar84 = pshufhw(auVar84,auVar84,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      sVar7 = auVar84._8_2_;
      sVar8 = auVar84._10_2_;
      sVar9 = auVar84._12_2_;
      sVar10 = auVar84._14_2_;
      local_70 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar84[0xe] - (0xff < sVar10),
                          CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar84[0xc] - (0xff < sVar9),
                                   CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar84[10] -
                                            (0xff < sVar8),
                                            CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar84[8] -
                                                     (0xff < sVar7),
                                                     CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar84[6] - (0xff < sVar6),
                                                              CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar84[4] - (0xff < sVar5)
                                                                       ,CONCAT11((0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar84[2] -
                                                                                 (0xff < sVar4),
                                                                                 (0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar84[0] -
                                                                                 (0xff < sVar3))))))
                                  ));
      auVar11._8_6_ = 0;
      auVar11._0_8_ = local_78;
      auVar11[0xe] = (char)(local_78 >> 0x38);
      auVar17._8_4_ = 0;
      auVar17._0_8_ = local_78;
      auVar17[0xc] = (char)(local_78 >> 0x30);
      auVar17._13_2_ = auVar11._13_2_;
      auVar23._8_4_ = 0;
      auVar23._0_8_ = local_78;
      auVar23._12_3_ = auVar17._12_3_;
      auVar29._8_2_ = 0;
      auVar29._0_8_ = local_78;
      auVar29[10] = (char)(local_78 >> 0x28);
      auVar29._11_4_ = auVar23._11_4_;
      auVar35._8_2_ = 0;
      auVar35._0_8_ = local_78;
      auVar35._10_5_ = auVar29._10_5_;
      auVar41[8] = (char)(local_78 >> 0x20);
      auVar41._0_8_ = local_78;
      auVar41._9_6_ = auVar35._9_6_;
      auVar88[7] = 0;
      auVar88._0_7_ = auVar41._8_7_;
      auVar59._7_8_ = 0;
      auVar59._0_7_ = auVar41._8_7_;
      auVar71._1_8_ = SUB158(auVar59 << 0x40,7);
      auVar71[0] = (char)(local_78 >> 0x18);
      auVar71._9_6_ = 0;
      auVar60._1_10_ = SUB1510(auVar71 << 0x30,5);
      auVar60[0] = (char)(local_78 >> 0x10);
      auVar72._11_4_ = 0;
      auVar72._0_11_ = auVar60;
      auVar47[2] = (char)(local_78 >> 8);
      auVar47._0_2_ = (ushort)local_78;
      auVar47._3_12_ = SUB1512(auVar72 << 0x20,3);
      auVar49._2_13_ = auVar47._2_13_;
      auVar49._0_2_ = (ushort)local_78 & 0xff;
      auVar88._8_4_ = auVar49._0_4_;
      auVar88._12_4_ = auVar60._0_4_;
      auVar84 = pshuflw(auVar88,auVar88,0x1b);
      auVar84 = pshufhw(auVar84,auVar84,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      sVar7 = auVar84._8_2_;
      sVar8 = auVar84._10_2_;
      sVar9 = auVar84._12_2_;
      sVar10 = auVar84._14_2_;
      local_78 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar84[0xe] - (0xff < sVar10),
                          CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar84[0xc] - (0xff < sVar9),
                                   CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar84[10] -
                                            (0xff < sVar8),
                                            CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar84[8] -
                                                     (0xff < sVar7),
                                                     CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar84[6] - (0xff < sVar6),
                                                              CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar84[4] - (0xff < sVar5)
                                                                       ,CONCAT11((0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar84[2] -
                                                                                 (0xff < sVar4),
                                                                                 (0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar84[0] -
                                                                                 (0xff < sVar3))))))
                                  ));
      auVar12._8_6_ = 0;
      auVar12._0_8_ = local_80;
      auVar12[0xe] = (char)(local_80 >> 0x38);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = local_80;
      auVar18[0xc] = (char)(local_80 >> 0x30);
      auVar18._13_2_ = auVar12._13_2_;
      auVar24._8_4_ = 0;
      auVar24._0_8_ = local_80;
      auVar24._12_3_ = auVar18._12_3_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = local_80;
      auVar30[10] = (char)(local_80 >> 0x28);
      auVar30._11_4_ = auVar24._11_4_;
      auVar36._8_2_ = 0;
      auVar36._0_8_ = local_80;
      auVar36._10_5_ = auVar30._10_5_;
      auVar42[8] = (char)(local_80 >> 0x20);
      auVar42._0_8_ = local_80;
      auVar42._9_6_ = auVar36._9_6_;
      auVar89[7] = 0;
      auVar89._0_7_ = auVar42._8_7_;
      auVar61._7_8_ = 0;
      auVar61._0_7_ = auVar42._8_7_;
      auVar73._1_8_ = SUB158(auVar61 << 0x40,7);
      auVar73[0] = (char)(local_80 >> 0x18);
      auVar73._9_6_ = 0;
      auVar62._1_10_ = SUB1510(auVar73 << 0x30,5);
      auVar62[0] = (char)(local_80 >> 0x10);
      auVar74._11_4_ = 0;
      auVar74._0_11_ = auVar62;
      auVar50._3_12_ = SUB1512(auVar74 << 0x20,3);
      auVar50[2] = (char)(local_80 >> 8);
      auVar50[1] = 0;
      auVar50[0] = (byte)local_80;
      auVar89._8_4_ = auVar50._0_4_;
      auVar89._12_4_ = auVar62._0_4_;
      auVar84 = pshuflw(auVar89,auVar89,0x1b);
      auVar84 = pshufhw(auVar84,auVar84,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      sVar7 = auVar84._8_2_;
      sVar8 = auVar84._10_2_;
      sVar9 = auVar84._12_2_;
      sVar10 = auVar84._14_2_;
      local_80 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar84[0xe] - (0xff < sVar10),
                          CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar84[0xc] - (0xff < sVar9),
                                   CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar84[10] -
                                            (0xff < sVar8),
                                            CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar84[8] -
                                                     (0xff < sVar7),
                                                     CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar84[6] - (0xff < sVar6),
                                                              CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar84[4] - (0xff < sVar5)
                                                                       ,CONCAT11((0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar84[2] -
                                                                                 (0xff < sVar4),
                                                                                 (0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar84[0] -
                                                                                 (0xff < sVar3))))))
                                  ));
      auVar13._8_6_ = 0;
      auVar13._0_8_ = local_88;
      auVar13[0xe] = (char)(local_88 >> 0x38);
      auVar19._8_4_ = 0;
      auVar19._0_8_ = local_88;
      auVar19[0xc] = (char)(local_88 >> 0x30);
      auVar19._13_2_ = auVar13._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = local_88;
      auVar25._12_3_ = auVar19._12_3_;
      auVar31._8_2_ = 0;
      auVar31._0_8_ = local_88;
      auVar31[10] = (char)(local_88 >> 0x28);
      auVar31._11_4_ = auVar25._11_4_;
      auVar37._8_2_ = 0;
      auVar37._0_8_ = local_88;
      auVar37._10_5_ = auVar31._10_5_;
      auVar43[8] = (char)(local_88 >> 0x20);
      auVar43._0_8_ = local_88;
      auVar43._9_6_ = auVar37._9_6_;
      auVar90[7] = 0;
      auVar90._0_7_ = auVar43._8_7_;
      auVar63._7_8_ = 0;
      auVar63._0_7_ = auVar43._8_7_;
      auVar75._1_8_ = SUB158(auVar63 << 0x40,7);
      auVar75[0] = (char)(local_88 >> 0x18);
      auVar75._9_6_ = 0;
      auVar64._1_10_ = SUB1510(auVar75 << 0x30,5);
      auVar64[0] = (char)(local_88 >> 0x10);
      auVar76._11_4_ = 0;
      auVar76._0_11_ = auVar64;
      auVar48[2] = (char)(local_88 >> 8);
      auVar48._0_2_ = (ushort)local_88;
      auVar48._3_12_ = SUB1512(auVar76 << 0x20,3);
      auVar51._2_13_ = auVar48._2_13_;
      auVar51._0_2_ = (ushort)local_88 & 0xff;
      auVar90._8_4_ = auVar51._0_4_;
      auVar90._12_4_ = auVar64._0_4_;
      auVar84 = pshuflw(auVar90,auVar90,0x1b);
      auVar84 = pshufhw(auVar84,auVar84,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      sVar7 = auVar84._8_2_;
      sVar8 = auVar84._10_2_;
      sVar9 = auVar84._12_2_;
      sVar10 = auVar84._14_2_;
      local_88 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar84[0xe] - (0xff < sVar10),
                          CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar84[0xc] - (0xff < sVar9),
                                   CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar84[10] -
                                            (0xff < sVar8),
                                            CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar84[8] -
                                                     (0xff < sVar7),
                                                     CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                              auVar84[6] - (0xff < sVar6),
                                                              CONCAT12((0 < sVar5) * (sVar5 < 0x100)
                                                                       * auVar84[4] - (0xff < sVar5)
                                                                       ,CONCAT11((0 < sVar4) *
                                                                                 (sVar4 < 0x100) *
                                                                                 auVar84[2] -
                                                                                 (0xff < sVar4),
                                                                                 (0 < sVar3) *
                                                                                 (sVar3 < 0x100) *
                                                                                 auVar84[0] -
                                                                                 (0xff < sVar3))))))
                                  ));
      auVar91._8_8_ = 0;
      auVar91._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_a4 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_a4 >> 0x10),local_a4))
                                                  >> 0x20),local_a4) >> 0x18),
                                           CONCAT12((char)((uint)local_a4 >> 8),(short)local_a4)) >>
                                 0x10),(short)local_a4) & 0xffff00ff00ff00ff;
      auVar84 = pshuflw(auVar91,auVar91,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      local_a4 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                          CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                   CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                            (0xff < sVar4),
                                            (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                            (0xff < sVar3))));
      auVar92._8_8_ = 0;
      auVar92._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_a8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_a8 >> 0x10),local_a8))
                                                  >> 0x20),local_a8) >> 0x18),
                                           CONCAT12((char)((uint)local_a8 >> 8),(short)local_a8)) >>
                                 0x10),(short)local_a8) & 0xffff00ff00ff00ff;
      auVar84 = pshuflw(auVar92,auVar92,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      local_a8 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6),
                          CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5),
                                   CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                            (0xff < sVar4),
                                            (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                            (0xff < sVar3))));
      swap4(dst);
      offset = local_78;
      uVar79 = local_80;
      auVar78._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
      auVar78[0] = (char)((uint)local_ac >> 0x18);
      auVar78._10_6_ = 0;
      auVar94._5_11_ = SUB1611(auVar78 << 0x30,5);
      auVar94[4] = (char)((uint)local_ac >> 0x10);
      auVar94._0_4_ = local_ac;
      auVar77._12_4_ = 0;
      auVar77._0_12_ = auVar94._4_12_;
      auVar93._3_13_ = SUB1613(auVar77 << 0x20,3);
      auVar93[2] = (char)((uint)local_ac >> 8);
      auVar93[0] = (byte)local_ac;
      auVar93[1] = 0;
      auVar84 = pshuflw(auVar93,auVar93,0x1b);
      sVar3 = auVar84._0_2_;
      sVar4 = auVar84._2_2_;
      sVar5 = auVar84._4_2_;
      sVar6 = auVar84._6_2_;
      cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar84[6] - (0xff < sVar6);
      local_ac = CONCAT13(cVar2,CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar84[4] - (0xff < sVar5)
                                         ,CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar84[2] -
                                                   (0xff < sVar4),
                                                   (0 < sVar3) * (sVar3 < 0x100) * auVar84[0] -
                                                   (0xff < sVar3))));
      if (((long)local_70 < 0) || (a = product_file->file_size, (long)a <= (long)local_70)) {
        pcVar82 = "CDF file has invalid offset for rVDR record";
      }
      else if ((long)local_78 < 0 || (long)a <= (long)local_78) {
        pcVar82 = "CDF file has invalid offset for zVDR record";
      }
      else if ((long)local_80 < 0 || (long)a <= (long)local_80) {
        pcVar82 = "CDF file has invalid offset for ADR record";
      }
      else if (local_a4 < 0) {
        pcVar82 = "CDF file has invalid number of variables in GDR record";
      }
      else if (local_a8 < 0) {
        pcVar82 = "CDF file has invalid number of attributes in GDR record";
      }
      else if (*dst < 0) {
        pcVar82 = "CDF file has invalid number of dimensions for rVariables in GDR record";
      }
      else {
        if (-1 < cVar2) {
          if (local_88 == a) {
            if ((((local_70 == 0) || (iVar80 = read_VDR(product_file,local_70,0), iVar80 == 0)) &&
                ((offset == 0 || (iVar80 = read_VDR(product_file,offset,1), iVar80 == 0)))) &&
               (iVar80 = read_ADR(product_file,uVar79), iVar80 == 0)) {
              *product = (coda_product *)product_file;
              return 0;
            }
          }
          else {
            coda_str64(local_88,s1);
            coda_str64(a,local_68);
            coda_set_error(-300,"CDF end of file position (%s) does not match file size (%s)",s1,
                           local_68);
          }
          goto LAB_00120a8d;
        }
        pcVar82 = "CDF file has invalid number of zVariables in GDR record";
      }
    }
    iVar80 = -300;
  }
  coda_set_error(iVar80,pcVar82);
LAB_00120a8d:
  coda_cdf_close((coda_product *)product_file);
  return -1;
}

Assistant:

int coda_cdf_reopen(coda_product **product)
{
    coda_cdf_product *product_file;
    coda_type_record *root_definition;
    uint32_t magic[2];

    product_file = (coda_cdf_product *)malloc(sizeof(coda_cdf_product));
    if (product_file == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       sizeof(coda_cdf_product), __FILE__, __LINE__);
        coda_close(*product);
        return -1;
    }
    product_file->filename = NULL;
    product_file->file_size = (*product)->file_size;
    product_file->format = coda_format_cdf;
    product_file->root_type = NULL;
    product_file->product_definition = NULL;
    product_file->product_variable_size = NULL;
    product_file->product_variable = NULL;
    product_file->mem_size = 0;
    product_file->mem_ptr = NULL;

    product_file->raw_product = *product;

    product_file->filename = strdup((*product)->filename);
    if (product_file->filename == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate filename string) (%s:%u)",
                       __FILE__, __LINE__);
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    /* magic */
    if (read_bytes(product_file->raw_product, 0, 8, magic) < 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_uint32(&magic[0]);
    swap_uint32(&magic[1]);
#endif
    if (magic[0] == 0x0000FFFF || magic[0] == 0xCDF26002)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF format version older than 3.0 is not supported");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    if (magic[1] == 0xCCCC0001)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "full file compression not supported for CDF files");
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    assert(magic[0] == 0xCDF30001 && magic[1] == 0x0000FFFF);

    /* create root type */
    root_definition = coda_type_record_new(coda_format_cdf);
    if (root_definition == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }
    product_file->root_type = coda_mem_record_new(root_definition, NULL);
    if (product_file->root_type == NULL)
    {
        coda_cdf_close((coda_product *)product_file);
        coda_type_release((coda_type *)root_definition);
        return -1;
    }
    coda_type_release((coda_type *)root_definition);

    if (read_file(product_file) != 0)
    {
        coda_cdf_close((coda_product *)product_file);
        return -1;
    }

    *product = (coda_product *)product_file;

    return 0;
}